

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O1

void __thiscall CatalogReader::CatalogReader(CatalogReader *this,AbstractMajor *major)

{
  (this->resourcesPath)._M_dataplus._M_p = (pointer)&(this->resourcesPath).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->resourcesPath,"resources/courses","");
  (this->resourceExtension)._M_dataplus._M_p = (pointer)&(this->resourceExtension).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->resourceExtension,".txt","");
  (this->beginDebugString)._M_dataplus._M_p = (pointer)&(this->beginDebugString).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->beginDebugString,"|-- START --- CATALOGREADER --- DEBUG --|","");
  (this->endDebugString)._M_dataplus._M_p = (pointer)&(this->endDebugString).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->endDebugString,"|---------------------------------------|","");
  this->major = major;
  this->debugOn = false;
  return;
}

Assistant:

CatalogReader(AbstractMajor* major) {
			this->major = major;
			this->debugOn = false;
		}